

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

string * __thiscall
TypeInfo::compose(string *__return_storage_ptr__,TypeInfo *this,string *nameSpace,string *prefix_)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  string local_110;
  byte local_eb;
  byte local_ea;
  allocator<char> local_e9;
  __sv_type local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *prefix__local;
  string *nameSpace_local;
  TypeInfo *this_local;
  
  local_28 = prefix_;
  prefix__local = nameSpace;
  nameSpace_local = &this->prefix;
  this_local = (TypeInfo *)__return_storage_ptr__;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->prefix);
  pcVar3 = " ";
  if (bVar1) {
    pcVar3 = "";
  }
  std::operator+(&local_88,&this->prefix,pcVar3);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (prefix__local);
  local_ea = 0;
  local_eb = 0;
  bVar1 = false;
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_a8,&this->type);
  }
  else {
    local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            starts_with(&this->type,local_e8);
    if (bVar1) {
      std::operator+(&local_d8,prefix__local,"::");
    }
    else {
      std::allocator<char>::allocator();
      local_ea = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_e9);
    }
    local_eb = 1;
    stripPrefix(&local_110,&this->type,local_28);
    bVar1 = true;
    std::operator+(&local_a8,&local_d8,&local_110);
  }
  std::operator+(&local_68,&local_88,&local_a8);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->postfix);
  pcVar3 = " ";
  if (bVar2) {
    pcVar3 = "";
  }
  std::operator+(&local_48,&local_68,pcVar3);
  std::operator+(__return_storage_ptr__,&local_48,&this->postfix);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  if ((local_eb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((local_ea & 1) != 0) {
    std::allocator<char>::~allocator(&local_e9);
  }
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string compose( std::string const & nameSpace, std::string const & prefix_ = "Vk" ) const
  {
    return prefix + ( prefix.empty() ? "" : " " ) +
           ( nameSpace.empty() ? type : ( ( ( type.starts_with( prefix_ ) ) ? ( nameSpace + "::" ) : "" ) + stripPrefix( type, prefix_ ) ) ) +
           ( postfix.empty() ? "" : " " ) + postfix;
  }